

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_mdl.h
# Opt level: O2

void __thiscall
ExampleModel::
WriteDVarExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::ExprArgWriter>
          (ExampleModel *this,int i,ExprArgWriter *ew)

{
  int opcode;
  double x;
  ExprArgWriter ew01;
  ExprArgWriter ew0101;
  
  opcode = (int)ew;
  switch(i) {
  case 0:
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::OPut1
              (&ew01,opcode,(char *)0xf);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::OPut2
              (&ew0101,(int)&ew01,(char *)0x0);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (&ew0101,-2.0);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              (&ew0101,0,"y");
    return;
  case 1:
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (ew,0.0);
    return;
  case 2:
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::OPut2
              (&ew01,opcode,(char *)0x0);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              (&ew01,2,"nl(t3)");
    x = 6.38;
    break;
  case 3:
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::OPut2
              (&ew01,opcode,(char *)0x5);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              (&ew01,0,"y");
    x = 2.0;
    break;
  default:
    goto switchD_001063d2_default;
  }
  mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
            (&ew01,x);
switchD_001063d2_default:
  return;
}

Assistant:

void WriteDVarExpr(int i, EWriter& ew) const {
    using namespace mp::nl;
    switch (i) {
    case 0:                  // nl(t3)
    {
      auto ew01 = ew.OPut1(ABS); // unary opcode
      // The argument:
      {                          // Can also split code / name:
        auto ew0101 = ew01.OPut2(ADD.code, "+"); // binary opcode
        ew0101.NPut(-2);         // 1st arg
        ew0101.VPut(0, "y");     // 2nd arg
      }
    } break;
    case 1:                  // t2
      ew.NPut(0);            // no non-linear part
      break;
    case 2:                  // t3
    {
      auto ew01 = ew.OPut2(ADD);
      ew01.VPut(2, "nl(t3)");
      ew01.NPut(6.38);
    } break;
    case 3:                  // t1
    {
      auto ew01 = ew.OPut2(POW);
      ew01.VPut(0, "y");
      ew01.NPut(2);
    } break;
    default:
      assert(false);
    {}
    }
  }